

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:387:59)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:387:59)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  Ref<embree::ParseStream> RVar1;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pSVar2;
  FileName *path_00;
  long *in_RSI;
  long in_RDI;
  Ref<embree::ParseStream> *cin_00;
  anon_class_8_1_8991fb9c_for_f *in_stack_ffffffffffffffb0;
  Ref<embree::ParseStream> local_40 [5];
  Ref<embree::ParseStream> *local_18;
  Ref<embree::ParseStream> *local_10;
  
  path_00 = (FileName *)(in_RDI + 0x30);
  cin_00 = local_40;
  RVar1.ptr = (ParseStream *)*in_RSI;
  local_18 = cin_00;
  if (RVar1.ptr != (ParseStream *)0x0) {
    pSVar2 = &(local_40[0].ptr)->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ;
    local_40[0].ptr = RVar1.ptr;
    (*(pSVar2->super_RefCount)._vptr_RefCount[2])();
    RVar1.ptr = local_40[0].ptr;
  }
  local_40[0].ptr = RVar1.ptr;
  anon_class_8_1_8991fb9c_for_f::operator()(in_stack_ffffffffffffffb0,cin_00,path_00);
  local_10 = local_40;
  if (local_40[0].ptr != (ParseStream *)0x0) {
    (*((local_40[0].ptr)->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])();
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }